

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

Value * __thiscall Json::Value::operator[](Value *this,ArrayIndex index)

{
  bool bVar1;
  runtime_error *this_00;
  iterator this_01;
  reference ppVar2;
  ArrayIndex in_ESI;
  undefined8 *in_RDI;
  value_type defaultValue;
  iterator it;
  CZString key;
  pair<const_Json::Value::CZString,_Json::Value> *in_stack_fffffffffffffef8;
  pair<const_Json::Value::CZString,_Json::Value> *in_stack_ffffffffffffff00;
  const_iterator in_stack_ffffffffffffff08;
  uint7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  bool bVar3;
  CZString *this_02;
  Value *in_stack_ffffffffffffff30;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_c0;
  _Base_ptr local_b8;
  undefined4 local_74;
  _Self local_70;
  _Self local_68;
  CZString local_60 [4];
  ArrayIndex local_14;
  Value *local_8;
  
  if (((*(ushort *)(in_RDI + 1) & 0xff) != 0) && ((*(ushort *)(in_RDI + 1) & 0xff) != 6)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"in Json::Value::operator[](ArrayIndex): requires arrayValue");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_14 = in_ESI;
  if ((*(ushort *)(in_RDI + 1) & 0xff) == 0) {
    Value((Value *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
          (ValueType)((ulong)in_stack_ffffffffffffff08._M_node >> 0x20));
    operator=((Value *)in_stack_ffffffffffffff00,(Value *)in_stack_fffffffffffffef8);
    ~Value(in_stack_ffffffffffffff30);
  }
  this_02 = local_60;
  CZString::CZString(this_02,local_14);
  this_01 = std::
            map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
            ::lower_bound((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                           *)in_stack_fffffffffffffef8,(key_type *)0x129563);
  local_68._M_node = this_01._M_node;
  local_70._M_node =
       (_Base_ptr)
       std::
       map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
       ::end((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              *)in_stack_fffffffffffffef8);
  bVar1 = std::operator!=(&local_68,&local_70);
  bVar3 = false;
  if (bVar1) {
    std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
              ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)0x1295bd);
    bVar3 = CZString::operator==
                      ((CZString *)in_stack_ffffffffffffff08._M_node,
                       &in_stack_ffffffffffffff00->first);
  }
  if (bVar3 == false) {
    std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
              ((pair<const_Json::Value::CZString,_Json::Value> *)this_01._M_node,this_02,
               (Value *)(ulong)in_stack_ffffffffffffff10);
    in_stack_ffffffffffffff00 = (pair<const_Json::Value::CZString,_Json::Value> *)*in_RDI;
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_c0,&local_68);
    local_b8 = (_Base_ptr)
               std::
               map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
               ::insert<std::pair<Json::Value::CZString_const,Json::Value>&>
                         ((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                           *)in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,
                          in_stack_fffffffffffffef8);
    local_68._M_node = local_b8;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
                        0x129696);
    local_8 = &ppVar2->second;
    local_74 = 1;
    std::pair<const_Json::Value::CZString,_Json::Value>::~pair(in_stack_ffffffffffffff00);
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
                        0x1295e8);
    local_8 = &ppVar2->second;
    local_74 = 1;
  }
  CZString::~CZString(&in_stack_ffffffffffffff00->first);
  return local_8;
}

Assistant:

Value& Value::operator[](ArrayIndex index) {
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == arrayValue,
      "in Json::Value::operator[](ArrayIndex): requires arrayValue");
  if (type_ == nullValue)
    *this = Value(arrayValue);
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  CZString key(index);
  ObjectValues::iterator it = value_.map_->lower_bound(key);
  if (it != value_.map_->end() && (*it).first == key)
    return (*it).second;

  ObjectValues::value_type defaultValue(key, null);
  it = value_.map_->insert(it, defaultValue);
  return (*it).second;
#else
  return value_.array_->resolveReference(index);
#endif
}